

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  bool ignoreErrors;
  int iVar4;
  cmCTestBuildHandler *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  string *psVar9;
  pointer ppcVar10;
  char *__s;
  size_t sVar11;
  cmGlobalGenerator *pcVar12;
  ostream *poVar13;
  pointer pcVar14;
  char *pcVar15;
  string dir;
  string e;
  string buildCommand;
  string local_238;
  string local_218;
  undefined1 local_1f8 [112];
  ios_base local_188 [264];
  char *local_80;
  cmake *local_78;
  string local_70;
  string local_50;
  
  pcVar5 = (cmCTestBuildHandler *)
           cmCTest::GetInitializedHandler
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  pcVar14 = local_1f8 + 0x10;
  local_1f8._0_8_ = pcVar14;
  if (pcVar5 == (cmCTestBuildHandler *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"internal CTest error. Cannot instantiate build handler","");
    cmCommand::SetError((cmCommand *)this,(string *)local_1f8);
    if ((pointer)local_1f8._0_8_ != pcVar14) {
LAB_0031608c:
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
LAB_00316111:
    pcVar5 = (cmCTestBuildHandler *)0x0;
  }
  else {
    this->Handler = pcVar5;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CTEST_BUILD_COMMAND","");
    pcVar6 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
    if ((pointer)local_1f8._0_8_ != pcVar14) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1f8._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"CTEST_CMAKE_GENERATOR","");
      pcVar6 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
      if ((pointer)local_1f8._0_8_ != pcVar14) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      pcVar7 = (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xc];
      if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1f8._0_8_ = pcVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CTEST_PROJECT_NAME","")
        ;
        pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
        if ((pointer)local_1f8._0_8_ != pcVar14) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1f8._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"CTEST_BUILD_CONFIGURATION","");
      pcVar8 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
      if ((pointer)local_1f8._0_8_ != pcVar14) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      ppcVar10 = (this->super_cmCTestHandlerCommand).Values.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar15 = ppcVar10[10];
      if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
         ((pcVar8 == (char *)0x0 || (pcVar15 = pcVar8, *pcVar8 == '\0')))) {
        psVar9 = cmCTest::GetConfigType_abi_cxx11_
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        pcVar15 = (psVar9->_M_dataplus)._M_p;
        ppcVar10 = (this->super_cmCTestHandlerCommand).Values.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      pcVar8 = ppcVar10[0xb];
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1f8._0_8_ = pcVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CTEST_BUILD_FLAGS","");
        pcVar8 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
        if ((pointer)local_1f8._0_8_ != pcVar14) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        ppcVar10 = (this->super_cmCTestHandlerCommand).Values.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      __s = ppcVar10[9];
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CTEST_BUILD_TARGET","")
        ;
        __s = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
      }
      if ((((pcVar6 == (char *)0x0) || (pcVar7 == (char *)0x0)) || (*pcVar6 == '\0')) ||
         (*pcVar7 == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1f8,
                   "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR and CTEST_PROJECT_NAME are set.\nCTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify that CTestConfig.cmake exists, or CTEST_PROJECT_NAME is set in the script, or PROJECT_NAME is passed as an argument to ctest_build.\nAlternatively, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                   ,0x19e);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base(local_188);
        goto LAB_00316111;
      }
      local_80 = "Release";
      if (pcVar15 != (char *)0x0) {
        local_80 = pcVar15;
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
LAB_00315f68:
        local_78 = cmMakefile::GetCMakeInstance
                             ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                              super_cmCommand.Makefile);
        local_1f8._0_8_ = local_1f8 + 0x10;
        sVar11 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,pcVar6,pcVar6 + sVar11);
        pcVar12 = cmake::CreateGlobalGenerator(local_78,(string *)local_1f8);
        this->GlobalGenerator = pcVar12;
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          pcVar12 = this->GlobalGenerator;
        }
        if (pcVar12 == (cmGlobalGenerator *)0x0) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1f8,"could not create generator named \"","");
          std::__cxx11::string::append(local_1f8);
          std::__cxx11::string::append(local_1f8);
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,(string *)local_1f8);
          cmSystemTools::s_FatalErrorOccured = true;
          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) goto LAB_0031608c;
          goto LAB_00316111;
        }
      }
      else {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1f8);
        iVar4 = std::__cxx11::string::compare(local_1f8);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        pcVar12 = this->GlobalGenerator;
        if (iVar4 != 0) {
          if (pcVar12 != (cmGlobalGenerator *)0x0) {
            (*pcVar12->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
          goto LAB_00315f68;
        }
        if (pcVar12 == (cmGlobalGenerator *)0x0) goto LAB_00315f68;
      }
      pcVar6 = "Debug";
      if (*local_80 != '\0') {
        pcVar6 = local_80;
      }
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_218,pcVar3,(string *)local_1f8);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      pcVar12 = this->GlobalGenerator;
      if (__s == (char *)0x0) {
        __s = "";
      }
      local_1f8._0_8_ = local_1f8 + 0x10;
      sVar11 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,__s,__s + sVar11);
      paVar1 = &local_238.field_2;
      local_238._M_dataplus._M_p = (pointer)paVar1;
      sVar11 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar6,pcVar6 + sVar11);
      pcVar6 = "";
      if (pcVar8 != (char *)0x0) {
        pcVar6 = pcVar8;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar11 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar6,pcVar6 + sVar11);
      ignoreErrors = cmMakefile::IgnoreErrorsCMP0061
                               ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                                super_cmCommand.Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                (&local_70,pcVar12,(string *)local_1f8,&local_238,&local_50,ignoreErrors);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"SetMakeCommand:",0xf)
      ;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f8,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x7f,local_238._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      std::ios_base::~ios_base(local_188);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
                 local_70._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar6
                 ,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar14 = local_1f8 + 0x10;
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1f8._0_8_ = pcVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CTEST_USE_LAUNCHERS","");
    pcVar6 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
    if ((pointer)local_1f8._0_8_ != pcVar14) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar6,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1f8._0_8_ = pcVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"CTEST_LABELS_FOR_SUBPROJECTS","");
    pcVar6 = cmMakefile::GetDefinition(pcVar2,(string *)local_1f8);
    if ((pointer)local_1f8._0_8_ != pcVar14) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if (pcVar6 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                 "LabelsForSubprojects",pcVar6,(this->super_cmCTestHandlerCommand).Quiet);
    }
    (pcVar5->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &pcVar5->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler = this->CTest->GetInitializedHandler("build");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return CM_NULLPTR;
  }
  this->Handler = (cmCTestBuildHandler*)handler;

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    const char* cmakeProjectName =
      (this->Values[ctb_PROJECT_NAME] && *this->Values[ctb_PROJECT_NAME])
      ? this->Values[ctb_PROJECT_NAME]
      : this->Makefile->GetDefinition("CTEST_PROJECT_NAME");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName && cmakeProjectName &&
        *cmakeProjectName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = CM_NULLPTR;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return CM_NULLPTR;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = CM_NULLPTR;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "and CTEST_PROJECT_NAME are set."
        "\n"
        "CTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify "
        "that CTestConfig.cmake exists, or CTEST_PROJECT_NAME "
        "is set in the script, or PROJECT_NAME is passed as an argument "
        "to ctest_build."
        "\n"
        "Alternatively, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return CM_NULLPTR;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}